

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflags.h
# Opt level: O3

void QWidgetPrivate::adjustFlags(WindowFlags *flags,QWidget *w)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = (flags->super_QFlagsStorageHelper<Qt::WindowType,_4>).super_QFlagsStorage<Qt::WindowType>.
          i;
  uVar4 = uVar1 & 0xff;
  uVar3 = uVar1;
  if (((w != (QWidget *)0x0) && (uVar4 == 0 || uVar4 == 0x12)) &&
     (*(long *)(*(long *)&w->field_0x8 + 0x10) == 0)) {
    (flags->super_QFlagsStorageHelper<Qt::WindowType,_4>).super_QFlagsStorage<Qt::WindowType>.i =
         uVar1 | 1;
    uVar4 = 1;
    uVar3 = uVar1 | 1;
  }
  if ((uVar3 >> 0x19 & 1) == 0) {
    if ((uVar1 & 0xa01f800) == 0) goto LAB_002f5984;
    uVar2 = uVar3;
    if ((uVar3 >> 0xb & 1) != 0) goto LAB_002f59aa;
    uVar2 = uVar3 | 0x3000;
  }
  else {
    if ((uVar3 & 0x801c000) != 0) {
      uVar3 = uVar3 & 0xffffc7ff | 0x3000;
      (flags->super_QFlagsStorageHelper<Qt::WindowType,_4>).super_QFlagsStorage<Qt::WindowType>.i =
           uVar3;
    }
    uVar2 = uVar3;
    if ((uVar1 & 0xa01f800) != 0) goto LAB_002f59aa;
LAB_002f5984:
    (flags->super_QFlagsStorageHelper<Qt::WindowType,_4>).super_QFlagsStorage<Qt::WindowType>.i =
         uVar3 | 0x8003000;
    if ((uVar4 < 0xc) && (uVar2 = uVar3 | 0x8003000, (0x828U >> (uVar4 & 0x1f) & 1) != 0))
    goto LAB_002f59aa;
    uVar2 = uVar3 | 0x8800f000;
  }
  (flags->super_QFlagsStorageHelper<Qt::WindowType,_4>).super_QFlagsStorage<Qt::WindowType>.i =
       uVar2;
LAB_002f59aa:
  if ((*(byte *)(*(long *)&w->field_0x8 + 0x242) & 8) != 0) {
    (flags->super_QFlagsStorageHelper<Qt::WindowType,_4>).super_QFlagsStorage<Qt::WindowType>.i =
         uVar2 | 0x80000;
  }
  return;
}

Assistant:

constexpr inline QFlags operator&(QFlags other) const noexcept { return QFlags(std::in_place, i & other.i); }